

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O2

QueryCounters * __thiscall
DatabaseSnapshot::execute
          (QueryCounters *__return_storage_ptr__,DatabaseSnapshot *this,Query *query,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *taints,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *datasets,Task *task,ResultWriter *out)

{
  atomic_uint64_t *paVar1;
  size_type __n;
  OnDiskDataset *this_00;
  pointer ppOVar2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  runtime_error *this_01;
  pointer ppOVar5;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> datasets_to_query;
  OnDiskDataset *dsptr;
  
  datasets_to_query.
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  datasets_to_query.
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  datasets_to_query.
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __n = (datasets->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  if (__n == 0) {
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::operator=
              (&datasets_to_query,&this->datasets);
  }
  else {
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::reserve
              (&datasets_to_query,__n);
    for (p_Var4 = (datasets->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(datasets->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      dsptr = find_dataset(this,(string *)(p_Var4 + 1));
      if (dsptr == (OnDiskDataset *)0x0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Invalid dataset specified in query");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>::
      emplace_back<OnDiskDataset_const*&>
                ((vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>> *)
                 &datasets_to_query,&dsptr);
    }
  }
  LOCK();
  (task->spec_->work_estimated_).super___atomic_base<unsigned_long>._M_i =
       (long)datasets_to_query.
             super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)datasets_to_query.
             super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  UNLOCK();
  QueryCounters::QueryCounters(__return_storage_ptr__);
  ppOVar2 = datasets_to_query.
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppOVar5 = datasets_to_query.
                 super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppOVar5 != ppOVar2; ppOVar5 = ppOVar5 + 1
      ) {
    this_00 = *ppOVar5;
    LOCK();
    paVar1 = &task->spec_->work_done_;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    bVar3 = OnDiskDataset::has_all_taints(this_00,taints);
    if (bVar3) {
      OnDiskDataset::execute(this_00,query,out,__return_storage_ptr__);
    }
  }
  std::_Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~_Vector_base
            (&datasets_to_query.
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>);
  return __return_storage_ptr__;
}

Assistant:

QueryCounters DatabaseSnapshot::execute(const Query &query,
                                        const std::set<std::string> &taints,
                                        const std::set<std::string> &datasets,
                                        Task *task, ResultWriter *out) const {
    std::vector<const OnDiskDataset *> datasets_to_query;
    if (datasets.empty()) {
        // No datasets selected explicitly == query everything.
        datasets_to_query = get_datasets();
    } else {
        datasets_to_query.reserve(datasets.size());
        for (const auto &dsname : datasets) {
            const auto *dsptr = find_dataset(dsname);
            if (dsptr == nullptr) {
                throw std::runtime_error("Invalid dataset specified in query");
            }
            datasets_to_query.emplace_back(dsptr);
        }
    }

    task->spec().estimate_work(datasets_to_query.size());

    QueryCounters counters;
    for (const auto *ds : datasets_to_query) {
        task->spec().add_progress(1);
        if (!ds->has_all_taints(taints)) {
            continue;
        }
        ds->execute(query, out, &counters);
    }
    return counters;
}